

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_container_close(tnt_stream *s)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  uint size;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  plVar4 = (long *)s->data;
  plVar5 = (long *)plVar4[6];
  bVar1 = *(byte *)(plVar5 + 1);
  if (bVar1 == 0) {
    return -1;
  }
  lVar8 = *plVar5;
  lVar7 = (ulong)(bVar1 - 1) * 0x10;
  size = *(uint *)(lVar8 + 8 + lVar7);
  cVar2 = *(char *)(lVar8 + 0xc + lVar7);
  if ((size & 1) != 0 && cVar2 == '\x06') {
    return -1;
  }
  uVar6 = *(ulong *)(lVar8 + lVar7);
  *(byte *)(plVar5 + 1) = bVar1 - 1;
  iVar3 = *(int *)((long)plVar5 + 0xc);
  if (iVar3 == 0) {
    return 0;
  }
  if (iVar3 != 2) {
    if (iVar3 == 1) {
      lVar8 = *plVar4;
      if (cVar2 == '\x06') {
        size = size >> 1;
        *(undefined1 *)(lVar8 + uVar6) = 0xdf;
      }
      else {
        *(undefined1 *)(lVar8 + uVar6) = 0xdd;
      }
      *(uint *)(lVar8 + 1 + uVar6) =
           size >> 0x18 | (size & 0xff0000) >> 8 | (size & 0xff00) << 8 | size << 0x18;
      return 0;
    }
    return -1;
  }
  if (cVar2 == '\x06') {
    bVar9 = 0x1ffff < size;
    if (0x1f < size) goto LAB_0010a37c;
    lVar8 = 0;
LAB_0010a3ec:
    mp_encode_map((char *)(uVar6 + *plVar4),size >> 1);
  }
  else {
    bVar9 = 0xffff < size;
    if (size < 0x10) {
      lVar8 = 0;
    }
    else {
LAB_0010a37c:
      lVar8 = (ulong)bVar9 * 2 + 2;
      lVar7 = (*(code *)plVar4[4])();
      if (lVar7 == 0) {
        return -1;
      }
      memmove((void *)((ulong)bVar9 * 2 + 3 + *plVar4 + uVar6),(void *)(*plVar4 + uVar6 + 1),
              ~uVar6 + plVar4[1]);
      if (cVar2 == '\x06') goto LAB_0010a3ec;
    }
    mp_encode_array((char *)(uVar6 + *plVar4),size);
  }
  plVar4[1] = plVar4[1] + lVar8;
  return 0;
}

Assistant:

ssize_t
tnt_object_container_close (struct tnt_stream *s)
{
	struct tnt_stream_buf   *sb = TNT_SBUF_CAST(s);
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size == 0) return -1;
	size_t       size   = sbo->stack[sbo->stack_size - 1].size;
	enum mp_type type   = sbo->stack[sbo->stack_size - 1].type;
	size_t       offset = sbo->stack[sbo->stack_size - 1].offset;
	if (type == MP_MAP && size % 2) return -1;
	sbo->stack_size -= 1;
	char *lenp = sb->data + offset;
	if (sbo->type == TNT_SBO_SIMPLE) {
		return 0;
	} else if (sbo->type == TNT_SBO_SPARSE) {
		if (type == MP_MAP)
			mp_encode_map32(lenp, size/2);
		else
			mp_encode_array32(lenp, size);
		return 0;
	} else if (sbo->type == TNT_SBO_PACKED) {
		size_t sz = 0;
		if (type == MP_MAP)
			sz = mp_sizeof_map(size/2);
		else
			sz = mp_sizeof_array(size);
		if (sz > 1) {
			if (!sb->resize(s, sz - 1))
				return -1;
			lenp = sb->data + offset;
			memmove(lenp + sz, lenp + 1, sb->size - offset - 1);
		}
		if (type == MP_MAP) {
			mp_encode_map(sb->data + offset, size/2);
		} else {
			mp_encode_array(sb->data + offset, size);
		}
		sb->size += (sz - 1);
		return 0;
	}
	return -1;
}